

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void cppcms::json::traits<char[19]>::set(value *v,vtype *in)

{
  char *in_RSI;
  value *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  json::value::str(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

static void set(value &v,vtype const &in)
		{					
			v.str(in);
		}